

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateEnd(zng_stream *strm)

{
  int iVar1;
  zng_stream *in_RDI;
  undefined4 local_4;
  
  iVar1 = inflateStateCheck(in_RDI);
  if (iVar1 == 0) {
    free_inflate(in_RDI);
    local_4 = 0;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateEnd)(PREFIX3(stream) *strm) {
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;

    /* Free allocated buffers */
    free_inflate(strm);

    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}